

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-gettimeofday.c
# Opt level: O0

int run_test_gettimeofday(void)

{
  int iVar1;
  int64_t eval_b_2;
  int64_t eval_a_2;
  int64_t eval_b_1;
  int64_t eval_a_1;
  int64_t eval_b;
  int64_t eval_a;
  undefined1 auStack_20 [4];
  int r;
  uv_timeval_t tv;
  
  _auStack_20 = 0;
  iVar1 = uv_gettimeofday((uv_timeval_t *)auStack_20);
  if ((long)iVar1 != 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-gettimeofday.c"
            ,0x1f,"r","==","0",(long)iVar1,"==",0);
    abort();
  }
  if (_auStack_20 == 0) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-gettimeofday.c"
            ,0x20,"0","!=","tv.tv_sec",0,"!=",0);
    abort();
  }
  iVar1 = uv_gettimeofday((uv_timeval_t *)0x0);
  if ((long)iVar1 != -0x16) {
    fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
            "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-gettimeofday.c"
            ,0x24,"r","==","UV_EINVAL",(long)iVar1,"==",0xffffffffffffffea);
    abort();
  }
  return 0;
}

Assistant:

TEST_IMPL(gettimeofday) {
  uv_timeval_t tv;
  int r;

  tv.tv_sec = 0;
  r = uv_gettimeofday(&tv);
  ASSERT_OK(r);
  ASSERT_NE(0, tv.tv_sec);

  /* Test invalid input. */
  r = uv_gettimeofday(NULL);
  ASSERT_EQ(r, UV_EINVAL);

  return 0;
}